

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_byte(bitstream *str)

{
  int iVar1;
  uint8_t *puVar2;
  bitstream *str_local;
  
  if (str->dir == VS_ENCODE) {
    switch(str->type) {
    case VS_H261:
    case VS_H263:
      break;
    case VS_H262:
      if ((str->curbyte < 2) && (1 < str->zero_bytes)) {
        fprintf(_stderr,"00 00 0%d emitted!\n",(ulong)str->curbyte);
        return 1;
      }
      break;
    case VS_H264:
      if ((str->curbyte < 4) && (str->zero_bytes == 2)) {
        if (str->bytesmax <= str->bytesnum) {
          if (str->bytesmax == 0) {
            str->bytesmax = 0x10;
          }
          else {
            str->bytesmax = str->bytesmax << 1;
          }
          puVar2 = (uint8_t *)realloc(str->bytes,(long)str->bytesmax);
          str->bytes = puVar2;
        }
        iVar1 = str->bytesnum;
        str->bytesnum = iVar1 + 1;
        str->bytes[iVar1] = '\x03';
        str->zero_bytes = 0;
      }
      break;
    default:
      abort();
    }
    if (str->bytesmax <= str->bytesnum) {
      if (str->bytesmax == 0) {
        str->bytesmax = 0x10;
      }
      else {
        str->bytesmax = str->bytesmax << 1;
      }
      puVar2 = (uint8_t *)realloc(str->bytes,(long)str->bytesmax);
      str->bytes = puVar2;
    }
    iVar1 = str->bytesnum;
    str->bytesnum = iVar1 + 1;
    str->bytes[iVar1] = str->curbyte;
    if (str->curbyte == '\0') {
      str->zero_bytes = str->zero_bytes + 1;
    }
    else {
      str->zero_bytes = 0;
    }
    str->curbyte = '\0';
  }
  else {
    if (str->bytesnum <= str->bytepos) {
      fprintf(_stderr,"End of bitstream in a NAL!\n");
      return 1;
    }
    iVar1 = str->bytepos;
    str->bytepos = iVar1 + 1;
    str->curbyte = str->bytes[iVar1];
    switch(str->type) {
    case VS_H261:
    case VS_H263:
      break;
    case VS_H262:
      if ((str->curbyte < 2) && (1 < str->zero_bytes)) {
        fprintf(_stderr,"00 00 0%d read in a NAL!\n",(ulong)str->curbyte);
        return 1;
      }
      break;
    case VS_H264:
      if (str->zero_bytes == 2) {
        if (str->curbyte < 3) {
          fprintf(_stderr,"00 00 0%d read in a NAL!\n",(ulong)str->curbyte);
          return 1;
        }
        if (str->curbyte == 3) {
          if (str->bytesnum <= str->bytepos) {
            fprintf(_stderr,"End of bitstream in a NAL!\n");
            return 1;
          }
          str->zero_bytes = 0;
          iVar1 = str->bytepos;
          str->bytepos = iVar1 + 1;
          str->curbyte = str->bytes[iVar1];
          if (3 < str->curbyte) {
            fprintf(_stderr,"Invalid escape sequence: 00 00 03 %02x!\n",(ulong)str->curbyte);
            return 1;
          }
        }
      }
      break;
    default:
      abort();
    }
    if (str->curbyte == '\0') {
      str->zero_bytes = str->zero_bytes + 1;
    }
    else {
      str->zero_bytes = 0;
    }
    str->hasbyte = 1;
  }
  str->bitpos = 7;
  return 0;
}

Assistant:

int vs_byte(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d emitted!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->curbyte < 4 && str->zero_bytes == 2) {
					/* escape */
					ADDARRAY(str->bytes, 3);
					str->zero_bytes = 0;
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		ADDARRAY(str->bytes, str->curbyte);
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->curbyte = 0;
	} else {
		if (str->bytepos >= str->bytesnum) {
			fprintf(stderr, "End of bitstream in a NAL!\n");
			return 1;
		}
		str->curbyte = str->bytes[str->bytepos++];
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->zero_bytes == 2) {
					switch (str->curbyte) {
						case 0:
						case 1:
						case 2:
							fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
							return 1;
						case 3:
							if (str->bytepos >= str->bytesnum) {
								fprintf(stderr, "End of bitstream in a NAL!\n");
								return 1;
							}
							str->zero_bytes = 0;
							str->curbyte = str->bytes[str->bytepos++];
							if (str->curbyte > 3) {
								fprintf(stderr, "Invalid escape sequence: 00 00 03 %02x!\n", str->curbyte);
								return 1;
							}
							break;
					}
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->hasbyte = 1;
	}
	str->bitpos = 7;
	return 0;
}